

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

pointer __thiscall
google::
dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
::alloc_impl<google::libc_allocator_with_realloc<A>_>::realloc_or_die
          (alloc_impl<google::libc_allocator_with_realloc<A>_> *this,pointer ptr,size_type n)

{
  pointer pAVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  pointer retval;
  pointer in_stack_ffffffffffffffd8;
  libc_allocator_with_realloc<A> *in_stack_ffffffffffffffe0;
  
  pAVar1 = libc_allocator_with_realloc<A>::reallocate
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0x10a4d77);
  if (pAVar1 == (pointer)0x0) {
    fprintf(_stderr,"sparsehash: FATAL ERROR: failed to reallocate %lu elements for ptr %p",in_RDX,
            in_RSI);
    exit(1);
  }
  return pAVar1;
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }